

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O1

bool __thiscall cbtBoxShape::isInside(cbtBoxShape *this,cbtVector3 *pt,cbtScalar tolerance)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  if ((pt->m_floats[0] <= fVar1 + tolerance) &&
     (auVar4._8_4_ = 0x80000000, auVar4._0_8_ = 0x8000000080000000, auVar4._12_4_ = 0x80000000,
     auVar4 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar4),
     auVar4._0_4_ - tolerance <= pt->m_floats[0])) {
    fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
            m_implicitShapeDimensions.m_floats[1];
    if ((pt->m_floats[1] <= fVar1 + tolerance) &&
       (auVar2._8_4_ = 0x80000000, auVar2._0_8_ = 0x8000000080000000, auVar2._12_4_ = 0x80000000,
       auVar4 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar2),
       auVar4._0_4_ - tolerance <= pt->m_floats[1])) {
      fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
              m_implicitShapeDimensions.m_floats[2];
      if (pt->m_floats[2] <= fVar1 + tolerance) {
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar4 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar3);
        return auVar4._0_4_ - tolerance <= pt->m_floats[2];
      }
    }
  }
  return false;
}

Assistant:

virtual bool isInside(const cbtVector3& pt, cbtScalar tolerance) const
	{
		cbtVector3 halfExtents = getHalfExtentsWithoutMargin();

		//cbtScalar minDist = 2*tolerance;

		bool result = (pt.x() <= (halfExtents.x() + tolerance)) &&
					  (pt.x() >= (-halfExtents.x() - tolerance)) &&
					  (pt.y() <= (halfExtents.y() + tolerance)) &&
					  (pt.y() >= (-halfExtents.y() - tolerance)) &&
					  (pt.z() <= (halfExtents.z() + tolerance)) &&
					  (pt.z() >= (-halfExtents.z() - tolerance));

		return result;
	}